

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnscopedName(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined1 uVar6;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  char *in_stack_ffffffffffffffd0;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    local_1 = false;
  }
  else {
    uVar6 = ParseUnqualifiedName(in_stack_ffffffffffffffe8.state_);
    if ((bool)uVar6) {
      local_1 = true;
    }
    else {
      iVar1 = (in_RDI->parse_state).mangled_idx;
      iVar2 = (in_RDI->parse_state).out_cur_idx;
      iVar3 = (in_RDI->parse_state).prev_name_idx;
      uVar4 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
      bVar5 = ParseTwoCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (((bVar5) &&
          (bVar5 = MaybeAppend((State *)CONCAT17(uVar6,CONCAT16(bVar5,CONCAT15(
                                                  in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,
                                                           in_stack_ffffffffffffffb0)))),
                               in_stack_ffffffffffffffa8), bVar5)) &&
         (bVar5 = ParseUnqualifiedName(in_stack_ffffffffffffffe8.state_), bVar5)) {
        local_1 = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = iVar1;
        (in_RDI->parse_state).out_cur_idx = iVar2;
        (in_RDI->parse_state).prev_name_idx = iVar3;
        *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar4;
        local_1 = false;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseUnscopedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseUnqualifiedName(state)) {
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "St") && MaybeAppend(state, "std::") &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}